

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Medals.cpp
# Opt level: O2

unsigned_long getRecs(PlayerInfo *player)

{
  undefined8 *puVar1;
  Config *this;
  unsigned_long uVar2;
  string_view in_key;
  
  puVar1 = (undefined8 *)Jupiter::Plugin::getName_abi_cxx11_();
  this = (Config *)Jupiter::Config::operator[](&player->varData,puVar1[1],*puVar1);
  in_key._M_str = "Recs";
  in_key._M_len = 4;
  uVar2 = Jupiter::Config::get<unsigned_long>(this,in_key,0);
  return uVar2;
}

Assistant:

unsigned long getRecs(const RenX::PlayerInfo &player)
{
	return player.varData[pluginInstance.getName()].get<unsigned long>("Recs"sv);
}